

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

bool PackedVertexPNTCUV::is_near(vec4 *vecA,vec4 *vecB)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  undefined1 local_1d;
  float epsilon;
  vec4 *vecB_local;
  vec4 *vecA_local;
  
  pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecA,0);
  fVar1 = *pfVar3;
  pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecB,0);
  bVar2 = is_near(fVar1,*pfVar3,0.00390625);
  local_1d = false;
  if (bVar2) {
    pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecA,1);
    fVar1 = *pfVar3;
    pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecB,1);
    bVar2 = is_near(fVar1,*pfVar3,0.00390625);
    local_1d = false;
    if (bVar2) {
      pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecA,2);
      fVar1 = *pfVar3;
      pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecB,2);
      bVar2 = is_near(fVar1,*pfVar3,0.00390625);
      local_1d = false;
      if (bVar2) {
        pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecA,3);
        fVar1 = *pfVar3;
        pfVar3 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](vecB,3);
        local_1d = is_near(fVar1,*pfVar3,0.00390625);
      }
    }
  }
  return local_1d;
}

Assistant:

static bool is_near(const glm::vec4 & vecA, const glm::vec4 & vecB)
  {
    const float epsilon = 1 / 256.f;
    return is_near(vecA[0], vecB[0], epsilon) and is_near(vecA[1], vecB[1], epsilon) and is_near(vecA[2], vecB[2], epsilon) and is_near(vecA[3], vecB[3], epsilon);
  }